

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
::initPrograms(QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
               *this,SourceCollections *sourceCollections)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  VkPrimitiveTopology *inputType;
  VkPrimitiveTopology *outputType;
  string local_9f0;
  ShaderSource local_9d0;
  allocator<char> local_9a1;
  string local_9a0;
  ostringstream local_980 [8];
  ostringstream source_2;
  string local_808;
  ShaderSource local_7e8;
  allocator<char> local_7b9;
  string local_7b8;
  string local_798;
  string local_778;
  ostringstream local_758 [8];
  ostringstream source_1;
  string local_5e0;
  ShaderSource local_5c0;
  allocator<char> local_591;
  string local_590;
  ostringstream local_570 [8];
  ostringstream source_te;
  string local_3f8;
  ShaderSource local_3d8;
  allocator<char> local_3a9;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream source_tc;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream source;
  SourceCollections *sourceCollections_local;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
  *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_190,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in highp vec4 in_position;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 1) in vec4 in_color;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color;\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tgl_Position = in_position;\n");
  poVar2 = std::operator<<(poVar2,"\tout_color = in_color;\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vertex",&local_1c1);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar3,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  if (((this->m_parametersGraphic).queryStatisticFlags & 0x300) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_388);
    pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar2 = std::operator<<((ostream *)local_388,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"#extension GL_EXT_tessellation_shader : require\n");
    poVar2 = std::operator<<(poVar2,"layout(vertices = 4) out;\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) in vec4 in_color[];\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color[];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"\tif( gl_InvocationID == 0 )\n");
    poVar2 = std::operator<<(poVar2,"\t{\n");
    poVar2 = std::operator<<(poVar2,"\t\tgl_TessLevelInner[0] = 4.0f;\n");
    poVar2 = std::operator<<(poVar2,"\t\tgl_TessLevelInner[1] = 4.0f;\n");
    poVar2 = std::operator<<(poVar2,"\t\tgl_TessLevelOuter[0] = 4.0f;\n");
    poVar2 = std::operator<<(poVar2,"\t\tgl_TessLevelOuter[1] = 4.0f;\n");
    poVar2 = std::operator<<(poVar2,"\t\tgl_TessLevelOuter[2] = 4.0f;\n");
    poVar2 = std::operator<<(poVar2,"\t\tgl_TessLevelOuter[3] = 4.0f;\n");
    poVar2 = std::operator<<(poVar2,"\t}\n");
    poVar2 = std::operator<<(poVar2,"\tout_color[gl_InvocationID] = in_color[gl_InvocationID];\n");
    poVar2 = std::operator<<(poVar2,
                             "\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                            );
    std::operator<<(poVar2,"}\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"tessellation_control",&local_3a9);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&sourceCollections->glslSources,&local_3a8);
    std::__cxx11::ostringstream::str();
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_3d8,&local_3f8);
    glu::ProgramSources::operator<<(pPVar3,&local_3d8);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
    std::__cxx11::ostringstream::ostringstream(local_570);
    pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar2 = std::operator<<((ostream *)local_570,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"#extension GL_EXT_tessellation_shader : require\n");
    poVar2 = std::operator<<(poVar2,"layout( quads, equal_spacing, ccw ) in;\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) in vec4 in_color[];\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color;\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"\tconst float u = gl_TessCoord.x;\n");
    poVar2 = std::operator<<(poVar2,"\tconst float v = gl_TessCoord.y;\n");
    poVar2 = std::operator<<(poVar2,"\tconst float w = gl_TessCoord.z;\n");
    poVar2 = std::operator<<(poVar2,
                             "\tgl_Position = (1 - u) * (1 - v) * gl_in[0].gl_Position +(1 - u) * v * gl_in[1].gl_Position + u * (1 - v) * gl_in[2].gl_Position + u * v * gl_in[3].gl_Position;\n"
                            );
    poVar2 = std::operator<<(poVar2,"\tout_color = in_color[0];\n");
    std::operator<<(poVar2,"}\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_590,"tessellation_evaluation",&local_591);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&sourceCollections->glslSources,&local_590);
    std::__cxx11::ostringstream::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_5c0,&local_5e0);
    glu::ProgramSources::operator<<(pPVar3,&local_5c0);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator(&local_591);
    std::__cxx11::ostringstream::~ostringstream(local_570);
    std::__cxx11::ostringstream::~ostringstream(local_388);
  }
  if (((this->m_parametersGraphic).queryStatisticFlags & 0x78) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_758);
    pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar2 = std::operator<<((ostream *)local_758,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(");
    QueryPool::(anonymous_namespace)::inputTypeToGLString_abi_cxx11_
              (&local_778,(_anonymous_namespace_ *)&(this->m_parametersGraphic).primitiveTopology,
               inputType);
    poVar2 = std::operator<<(poVar2,(string *)&local_778);
    poVar2 = std::operator<<(poVar2,") in;\n");
    poVar2 = std::operator<<(poVar2,"layout(");
    QueryPool::(anonymous_namespace)::outputTypeToGLString_abi_cxx11_
              (&local_798,(_anonymous_namespace_ *)&(this->m_parametersGraphic).primitiveTopology,
               outputType);
    poVar2 = std::operator<<(poVar2,(string *)&local_798);
    poVar2 = std::operator<<(poVar2,", max_vertices = 16) out;\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) in vec4 in_color[];\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color;\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"\tout_color = in_color[0];\n");
    poVar2 = std::operator<<(poVar2,"\tgl_Position = gl_in[0].gl_Position;\n");
    poVar2 = std::operator<<(poVar2,"\tEmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\tEndPrimitive();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tout_color = in_color[0];\n");
    poVar2 = std::operator<<(poVar2,"\tgl_Position = vec4(1.0, 1.0, 1.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"\tEmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\tout_color = in_color[0];\n");
    poVar2 = std::operator<<(poVar2,"\tgl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"\tEmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\tEndPrimitive();\n");
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_798);
    std::__cxx11::string::~string((string *)&local_778);
    if (((this->m_parametersGraphic).primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) ||
       ((this->m_parametersGraphic).primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST)) {
      poVar2 = std::operator<<((ostream *)local_758,"\n");
      poVar2 = std::operator<<(poVar2,"\tout_color = in_color[0];\n");
      poVar2 = std::operator<<(poVar2,"\tgl_Position = gl_in[0].gl_Position;\n");
      poVar2 = std::operator<<(poVar2,"\tEmitVertex();\n");
      poVar2 = std::operator<<(poVar2,"\tout_color = in_color[0];\n");
      poVar2 = std::operator<<(poVar2,"\tgl_Position = gl_in[1].gl_Position;\n");
      poVar2 = std::operator<<(poVar2,"\tEmitVertex();\n");
      poVar2 = std::operator<<(poVar2,"\tout_color = in_color[0];\n");
      poVar2 = std::operator<<(poVar2,"\tgl_Position = gl_in[2].gl_Position;\n");
      poVar2 = std::operator<<(poVar2,"\tEmitVertex();\n");
      poVar2 = std::operator<<(poVar2,"\tout_color = in_color[0];\n");
      poVar2 = std::operator<<(poVar2,
                               "\tgl_Position = vec4(gl_in[2].gl_Position.x, gl_in[1].gl_Position.y, 1.0, 1.0);\n"
                              );
      poVar2 = std::operator<<(poVar2,"\tEmitVertex();\n");
      std::operator<<(poVar2,"\tEndPrimitive();\n");
    }
    else {
      poVar2 = std::operator<<((ostream *)local_758,"\tout_color = in_color[0];\n");
      poVar2 = std::operator<<(poVar2,"\tgl_Position =  vec4(1.0, 1.0, 1.0, 1.0);\n");
      poVar2 = std::operator<<(poVar2,"\tEmitVertex();\n");
      poVar2 = std::operator<<(poVar2,"\tout_color = in_color[0];\n");
      poVar2 = std::operator<<(poVar2,"\tgl_Position = vec4(1.0, -1.0, 1.0, 1.0);\n");
      poVar2 = std::operator<<(poVar2,"\tEmitVertex();\n");
      poVar2 = std::operator<<(poVar2,"\tout_color = in_color[0];\n");
      poVar2 = std::operator<<(poVar2,"\tgl_Position = vec4(-1.0, 1.0, 1.0, 1.0);\n");
      poVar2 = std::operator<<(poVar2,"\tEmitVertex();\n");
      poVar2 = std::operator<<(poVar2,"\tout_color = in_color[0];\n");
      poVar2 = std::operator<<(poVar2,"\tgl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n");
      poVar2 = std::operator<<(poVar2,"\tEmitVertex();\n");
      std::operator<<(poVar2,"\tEndPrimitive();\n");
    }
    std::operator<<((ostream *)local_758,"}\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"geometry",&local_7b9);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&sourceCollections->glslSources,&local_7b8);
    std::__cxx11::ostringstream::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_7e8,&local_808);
    glu::ProgramSources::operator<<(pPVar3,&local_7e8);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_7e8);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::allocator<char>::~allocator(&local_7b9);
    std::__cxx11::ostringstream::~ostringstream(local_758);
  }
  std::__cxx11::ostringstream::ostringstream(local_980);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_980,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in vec4 in_color;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color;\n");
  poVar2 = std::operator<<(poVar2,"void main()\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tout_color = in_color;\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"fragment",&local_9a1);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_9a0);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_9d0,&local_9f0);
  glu::ProgramSources::operator<<(pPVar3,&local_9d0);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  std::__cxx11::ostringstream::~ostringstream(local_980);
  return;
}

Assistant:

void initPrograms(SourceCollections& sourceCollections) const
	{
		{ // Vertex Shader
			std::ostringstream	source;
			source	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
					<< "layout(location = 0) in highp vec4 in_position;\n"
					<< "layout(location = 1) in vec4 in_color;\n"
					<< "layout(location = 0) out vec4 out_color;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = in_position;\n"
					<< "	out_color = in_color;\n"
					<< "}\n";
			sourceCollections.glslSources.add("vertex") << glu::VertexSource(source.str());
		}

		if (m_parametersGraphic.queryStatisticFlags & (VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT|
									VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT))
		{// Tessellation control & evaluation
			std::ostringstream source_tc;
			source_tc	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
						<< "#extension GL_EXT_tessellation_shader : require\n"
						<< "layout(vertices = 4) out;\n"
						<< "layout(location = 0) in vec4 in_color[];\n"
						<< "layout(location = 0) out vec4 out_color[];\n"
						<< "\n"
						<< "void main (void)\n"
						<< "{\n"
						<< "	if( gl_InvocationID == 0 )\n"
						<< "	{\n"
						<< "		gl_TessLevelInner[0] = 4.0f;\n"
						<< "		gl_TessLevelInner[1] = 4.0f;\n"
						<< "		gl_TessLevelOuter[0] = 4.0f;\n"
						<< "		gl_TessLevelOuter[1] = 4.0f;\n"
						<< "		gl_TessLevelOuter[2] = 4.0f;\n"
						<< "		gl_TessLevelOuter[3] = 4.0f;\n"
						<< "	}\n"
						<< "	out_color[gl_InvocationID] = in_color[gl_InvocationID];\n"
						<< "	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
						<< "}\n";
			sourceCollections.glslSources.add("tessellation_control") << glu::TessellationControlSource(source_tc.str());

			std::ostringstream source_te;
			source_te	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
						<< "#extension GL_EXT_tessellation_shader : require\n"
						<< "layout( quads, equal_spacing, ccw ) in;\n"
						<< "layout(location = 0) in vec4 in_color[];\n"
						<< "layout(location = 0) out vec4 out_color;\n"
						<< "void main (void)\n"
						<< "{\n"
						<< "	const float u = gl_TessCoord.x;\n"
						<< "	const float v = gl_TessCoord.y;\n"
						<< "	const float w = gl_TessCoord.z;\n"
						<< "	gl_Position = (1 - u) * (1 - v) * gl_in[0].gl_Position +(1 - u) * v * gl_in[1].gl_Position + u * (1 - v) * gl_in[2].gl_Position + u * v * gl_in[3].gl_Position;\n"
						<< "	out_color = in_color[0];\n"
						<< "}\n";
			sourceCollections.glslSources.add("tessellation_evaluation") << glu::TessellationEvaluationSource(source_te.str());
		}

		if(m_parametersGraphic.queryStatisticFlags & (VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT | VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT |
									VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT | VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT))
		{ // Geometry Shader
			std::ostringstream	source;
			source	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
					<< "layout("<<inputTypeToGLString(m_parametersGraphic.primitiveTopology)<<") in;\n"
					<< "layout("<<outputTypeToGLString (m_parametersGraphic.primitiveTopology)<<", max_vertices = 16) out;\n"
					<< "layout(location = 0) in vec4 in_color[];\n"
					<< "layout(location = 0) out vec4 out_color;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	out_color = in_color[0];\n"
					<< "	gl_Position = gl_in[0].gl_Position;\n"
					<< "	EmitVertex();\n"
					<< "	EndPrimitive();\n"
					<< "\n"
					<< "	out_color = in_color[0];\n"
					<< "	gl_Position = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	EmitVertex();\n"
					<< "	out_color = in_color[0];\n"
					<< "	gl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n"
					<< "	EmitVertex();\n"
					<< "	EndPrimitive();\n"
					<< "\n";
			if (m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP ||
				m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST)
			{
				source	<< "\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = gl_in[0].gl_Position;\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = gl_in[1].gl_Position;\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = gl_in[2].gl_Position;\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(gl_in[2].gl_Position.x, gl_in[1].gl_Position.y, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	EndPrimitive();\n";
			}
			else
			{
				source	<< "	out_color = in_color[0];\n"
						<< "	gl_Position =  vec4(1.0, 1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(1.0, -1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(-1.0, 1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	EndPrimitive();\n";
			}
			source	<< "}\n";
			sourceCollections.glslSources.add("geometry") << glu::GeometrySource(source.str());
		}

		{ // Fragment Shader
			std::ostringstream	source;
			source	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
					<< "layout(location = 0) in vec4 in_color;\n"
					<< "layout(location = 0) out vec4 out_color;\n"
					<< "void main()\n"
					<<"{\n"
					<< "	out_color = in_color;\n"
					<< "}\n";
			sourceCollections.glslSources.add("fragment") << glu::FragmentSource(source.str());
		}
	}